

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgttb(fitsfile *fptr,LONGLONG *rowlen,LONGLONG *nrows,LONGLONG *pcount,long *tfields,
          int *status)

{
  int iVar1;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    iVar1 = fftkyn(fptr,2,"BITPIX","8",status);
    if (iVar1 == 0xd0) {
      *status = 0xde;
      iVar1 = 0xde;
    }
    else if (*status == 0xd1) {
      *status = 0xd3;
      iVar1 = 0xd3;
    }
    else {
      iVar1 = fftkyn(fptr,3,"NAXIS","2",status);
      if (iVar1 == 0xd0) {
        *status = 0xdf;
        iVar1 = 0xdf;
      }
      else if (*status == 0xd1) {
        *status = 0xd4;
        iVar1 = 0xd4;
      }
      else {
        iVar1 = ffgtknjj(fptr,4,"NAXIS1",rowlen,status);
        if (iVar1 != 0xd0) {
          if (*status == 0xd1) {
            return 0;
          }
          iVar1 = ffgtknjj(fptr,5,"NAXIS2",nrows,status);
          if (iVar1 != 0xd0) {
            if (*status == 0xd1) {
              return 0;
            }
            iVar1 = ffgtknjj(fptr,6,"PCOUNT",pcount,status);
            if (iVar1 == 0xd0) {
              *status = 0xe4;
              return 0xe4;
            }
            if (*status == 0xd1) {
              *status = 0xd6;
              return 0xd6;
            }
            iVar1 = fftkyn(fptr,7,"GCOUNT","1",status);
            if (iVar1 == 0xd0) {
              *status = 0xe5;
              return 0xe5;
            }
            if (*status == 0xd1) {
              *status = 0xd7;
              return 0xd7;
            }
            iVar1 = ffgtkn(fptr,8,"TFIELDS",tfields,status);
            if (iVar1 == 0xd0) {
              *status = 0xe6;
              return 0xe6;
            }
            iVar1 = *status;
            if ((iVar1 != 0xd1) && (*tfields < 1000)) {
              if (0 < iVar1) {
                ffpmsg("Error reading required keywords in the table header (FTGTTB).");
              }
              return *status;
            }
            return (uint)(iVar1 == 0xd8);
          }
        }
        *status = 0xe0;
        iVar1 = 0xe0;
      }
    }
  }
  return iVar1;
}

Assistant:

int ffgttb(fitsfile *fptr,      /* I - FITS file pointer*/
           LONGLONG *rowlen,        /* O - length of a table row, in bytes */
           LONGLONG *nrows,         /* O - number of rows in the table */
           LONGLONG *pcount,    /* O - value of PCOUNT keyword */
           long *tfields,       /* O - number of fields in the table */
           int *status)         /* IO - error status    */
{
/*
  Get and Test TaBle;
  Test that this is a legal ASCII or binary table and get some keyword values.
  We assume that the calling routine has already tested the 1st keyword
  of the extension to ensure that this is really a table extension.
*/
    if (*status > 0)
        return(*status);

    if (fftkyn(fptr, 2, "BITPIX", "8", status) == BAD_ORDER) /* 2nd keyword */
        return(*status = NO_BITPIX);  /* keyword not BITPIX */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_BITPIX); /* value != 8 */

    if (fftkyn(fptr, 3, "NAXIS", "2", status) == BAD_ORDER) /* 3rd keyword */
        return(*status = NO_NAXIS);  /* keyword not NAXIS */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_NAXIS); /* value != 2 */

    if (ffgtknjj(fptr, 4, "NAXIS1", rowlen, status) == BAD_ORDER) /* 4th key */
        return(*status = NO_NAXES);  /* keyword not NAXIS1 */
    else if (*status == NOT_POS_INT)
        return(*status == BAD_NAXES); /* bad NAXIS1 value */

    if (ffgtknjj(fptr, 5, "NAXIS2", nrows, status) == BAD_ORDER) /* 5th key */
        return(*status = NO_NAXES);  /* keyword not NAXIS2 */
    else if (*status == NOT_POS_INT)
        return(*status == BAD_NAXES); /* bad NAXIS2 value */

    if (ffgtknjj(fptr, 6, "PCOUNT", pcount, status) == BAD_ORDER) /* 6th key */
        return(*status = NO_PCOUNT);  /* keyword not PCOUNT */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_PCOUNT); /* bad PCOUNT value */

    if (fftkyn(fptr, 7, "GCOUNT", "1", status) == BAD_ORDER) /* 7th keyword */
        return(*status = NO_GCOUNT);  /* keyword not GCOUNT */
    else if (*status == NOT_POS_INT)
        return(*status = BAD_GCOUNT); /* value != 1 */

    if (ffgtkn(fptr, 8, "TFIELDS", tfields, status) == BAD_ORDER) /* 8th key*/
        return(*status = NO_TFIELDS);  /* keyword not TFIELDS */
    else if (*status == NOT_POS_INT || *tfields > 999)
        return(*status == BAD_TFIELDS); /* bad TFIELDS value */


    if (*status > 0)
       ffpmsg(
       "Error reading required keywords in the table header (FTGTTB).");

    return(*status);
}